

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.h
# Opt level: O2

bool endsWith(string *str,string *prefix)

{
  ulong __n;
  int iVar1;
  
  __n = prefix->_M_string_length;
  if (str->_M_string_length < __n) {
    return false;
  }
  iVar1 = strncmp((str->_M_dataplus)._M_p + (str->_M_string_length - __n),(prefix->_M_dataplus)._M_p
                  ,__n);
  return iVar1 == 0;
}

Assistant:

inline bool endsWith(const std::string& str, const std::string& prefix) {
  if (str.size() < prefix.size())
    return false;

  return strncmp(str.data() + str.size() - prefix.size(),
                 prefix.data(),
                 prefix.size()) == 0;
}